

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O1

Pair * ZXing::OneD::ReadPair(Pair *__return_storage_ptr__,PatternView *view,bool rightPair)

{
  Iterator puVar1;
  Character CVar2;
  Character CVar3;
  long lVar4;
  int iVar5;
  undefined7 in_register_00000011;
  Iterator puVar6;
  uint uVar7;
  int iVar8;
  ushort uVar9;
  value_type *pvVar10;
  PatternView *pPVar11;
  Iterator puVar12;
  uint uVar13;
  ulong uVar14;
  int i;
  ulong uVar15;
  float fVar16;
  float bestVariance;
  float local_10c;
  PatternView local_100 [3];
  undefined4 local_a0;
  PatternView local_98 [3];
  undefined4 local_38;
  
  puVar1 = view->_data;
  pvVar10 = (value_type *)&ParseFinderPattern::REVERSED_FINDER_PATTERNS;
  pPVar11 = local_100;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    pPVar11->_data = *(Iterator *)pvVar10;
    pvVar10 = pvVar10 + 4;
    pPVar11 = (PatternView *)&pPVar11->_size;
  }
  uVar15 = 0;
  local_a0 = 0;
  pvVar10 = (value_type *)&ParseFinderPattern::FINDER_PATTERNS;
  pPVar11 = local_98;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    pPVar11->_data = *(Iterator *)pvVar10;
    pvVar10 = pvVar10 + 4;
    pPVar11 = (PatternView *)&pPVar11->_size;
  }
  local_38 = 0;
  pPVar11 = local_98;
  if ((int)CONCAT71(in_register_00000011,rightPair) != 0) {
    pPVar11 = local_100;
  }
  uVar14 = 0xffffffff;
  local_10c = 0.2;
  do {
    fVar16 = RowReader::PatternMatchVariance<unsigned_short,unsigned_short>
                       (puVar1 + 8,(unsigned_short *)pPVar11,5,0.45);
    if (local_10c <= fVar16) {
      if ((fVar16 == local_10c) && (!NAN(fVar16) && !NAN(local_10c))) {
        uVar14 = 0xffffffff;
      }
    }
    else {
      if (local_10c <= fVar16) {
        fVar16 = local_10c;
      }
      uVar14 = uVar15 & 0xffffffff;
      local_10c = fVar16;
    }
    uVar15 = uVar15 + 1;
    pPVar11 = (PatternView *)((long)&pPVar11->_size + 2);
  } while (uVar15 != 10);
  uVar13 = ~(uint)uVar14;
  if (!rightPair) {
    uVar13 = (uint)uVar14 + 1;
  }
  if (uVar13 != 0) {
    local_100[0]._data = view->_data + 0xd;
    if (!rightPair) {
      local_100[0]._data = view->_data;
    }
    local_100[0]._base = view->_base;
    local_100[0]._end = view->_end;
    local_100[0]._size = 8;
    CVar2 = ReadDataCharacter(local_100,true,rightPair);
    if (CVar2.value != -1) {
      local_100[0]._data = view->_data + 0xd;
      if (rightPair) {
        local_100[0]._data = view->_data;
      }
      local_100[0]._base = view->_base;
      local_100[0]._end = view->_end;
      local_100[0]._size = 8;
      uVar7 = 0;
      CVar3 = ReadDataCharacter(local_100,false,rightPair);
      if (CVar3.value != -1) {
        puVar1 = view->_data;
        puVar6 = view->_base;
        if (puVar6 != puVar1) {
          uVar9 = 0;
          puVar12 = puVar6;
          do {
            uVar9 = uVar9 + *puVar12;
            puVar12 = puVar12 + 1;
          } while (puVar12 != puVar1);
          uVar7 = (uint)uVar9;
        }
        if (puVar6 == puVar1 + view->_size) {
          iVar5 = -1;
        }
        else {
          uVar9 = 0;
          do {
            uVar9 = uVar9 + *puVar6;
            puVar6 = puVar6 + 1;
          } while (puVar6 != puVar1 + view->_size);
          iVar5 = uVar9 - 1;
        }
        iVar8 = uVar7 - puVar1[-1];
        iVar5 = iVar5 + (uint)puVar1[0x15] * 2;
        __return_storage_ptr__->left = CVar2;
        __return_storage_ptr__->right = CVar3;
        goto LAB_0015f292;
      }
    }
  }
  (__return_storage_ptr__->left).value = -1;
  (__return_storage_ptr__->left).checksum = 0;
  (__return_storage_ptr__->right).value = -1;
  (__return_storage_ptr__->right).checksum = 0;
  iVar5 = 1;
  iVar8 = -1;
  uVar13 = 0;
LAB_0015f292:
  __return_storage_ptr__->finder = uVar13;
  __return_storage_ptr__->xStart = iVar8;
  __return_storage_ptr__->xStop = iVar5;
  __return_storage_ptr__->y = -1;
  __return_storage_ptr__->count = 1;
  return __return_storage_ptr__;
}

Assistant:

static Pair ReadPair(const PatternView& view, bool rightPair)
{
	if (int pattern = ParseFinderPattern(Finder(view), rightPair))
		if (auto outside = ReadDataCharacter(rightPair ? RightChar(view) : LeftChar(view), true, rightPair))
			if (auto inside = ReadDataCharacter(rightPair ? LeftChar(view) : RightChar(view), false, rightPair)) {
				// include left and right guards
				int xStart = view.pixelsInFront() - view[-1];
				int xStop  = view.pixelsTillEnd() + 2 * view[FULL_PAIR_SIZE];
				return {outside, inside, pattern, xStart, xStop};
			}

	return {};
}